

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReverseLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  Tensor *this_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string err;
  ReverseLayerParams *params;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    validateOutputCount((Result *)&params,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,(Result *)&params);
    Result::~Result((Result *)&params);
  }
  err.field_2._8_8_ =
       (size_type)Specification::NeuralNetworkLayer::reverse(r.m_message.field_2._8_8_);
  iVar2 = Specification::NeuralNetworkLayer::inputtensor_size
                    ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  if (0 < iVar2) {
    uVar3 = Specification::ReverseLayerParams::reversedim_size
                      ((ReverseLayerParams *)err.field_2._8_8_);
    this_00 = Specification::NeuralNetworkLayer::inputtensor
                        ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
    uVar4 = Specification::Tensor::rank(this_00);
    if (uVar3 != uVar4) {
      __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_
                        ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+(&local_f0,"Invalid size of reverse_dim for \'",__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     &local_f0,"\' layer.");
      std::__cxx11::string::~string((string *)&local_f0);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      goto LAB_00a37a9e;
    }
  }
  Result::Result(__return_storage_ptr__,(Result *)local_48);
LAB_00a37a9e:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReverseLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.reverse();
    // requires len(reverseDim) == rank(inputTensor)
    if (layer.inputtensor_size() > 0) {
        if (params.reversedim_size() != static_cast<int>(layer.inputtensor(0).rank())) {
            const std::string err = "Invalid size of reverse_dim for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}